

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbidata.cpp
# Opt level: O0

UBool __thiscall icu_63::RBBIDataWrapper::operator==(RBBIDataWrapper *this,RBBIDataWrapper *other)

{
  int iVar1;
  RBBIDataWrapper *other_local;
  RBBIDataWrapper *this_local;
  
  if (this->fHeader == other->fHeader) {
    this_local._7_1_ = '\x01';
  }
  else if (this->fHeader->fLength == other->fHeader->fLength) {
    iVar1 = memcmp(this->fHeader,other->fHeader,(ulong)this->fHeader->fLength);
    if (iVar1 == 0) {
      this_local._7_1_ = '\x01';
    }
    else {
      this_local._7_1_ = '\0';
    }
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool RBBIDataWrapper::operator ==(const RBBIDataWrapper &other) const {
    if (fHeader == other.fHeader) {
        return TRUE;
    }
    if (fHeader->fLength != other.fHeader->fLength) {
        return FALSE;
    }
    if (uprv_memcmp(fHeader, other.fHeader, fHeader->fLength) == 0) {
        return TRUE;
    }
    return FALSE;
}